

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedIndirectAddressingCase2CS::Run
          (AdvancedIndirectAddressingCase2CS *this)

{
  float fVar1;
  bool bVar2;
  GLuint GVar3;
  GLint GVar4;
  void *pvVar5;
  int local_b8;
  int local_b4;
  int i_2;
  int i_1;
  float *expected;
  GLfloat *out_data;
  undefined4 local_98;
  GLuint i;
  float data [4] [3];
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_cs;
  bool status;
  AdvancedIndirectAddressingCase2CS *pAStack_18;
  GLint blocksC;
  AdvancedIndirectAddressingCase2CS *this_local;
  
  pAStack_18 = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x90dc,(GLint *)((long)&glsl_cs + 4));
  if (glsl_cs._4_4_ < 8) {
    this_local = (AdvancedIndirectAddressingCase2CS *)0x10;
  }
  else {
    glsl_cs._3_1_ = 1;
    local_28 = 
    "\nlayout(local_size_x = 4) in;\nlayout(binding = 0, std430) buffer Material {\n  vec3 color;\n} g_material[4];\nlayout(binding = 4, std430) buffer OutputBuffer {\n  vec3 color[4];\n};\nuniform int g_material_id;\nvoid main() {\n  color[gl_LocalInvocationIndex] = vec3(g_material[g_material_id].color);\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\nlayout(local_size_x = 4) in;\nlayout(binding = 0, std430) buffer Material {\n  vec3 color;\n} g_material[4];\nlayout(binding = 4, std430) buffer OutputBuffer {\n  vec3 color[4];\n};\nuniform int g_material_id;\nvoid main() {\n  color[gl_LocalInvocationIndex] = vec3(g_material[g_material_id].color);\n}"
               ,&local_49);
    GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                      (&this->super_ShaderStorageBufferObjectBase,&local_48);
    this->m_program = GVar3;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar2 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar2) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,this->m_storage_buffer);
      memset(&local_98,0,0x30);
      local_98 = 0x3f800000;
      data[0][2] = 1.0;
      data[2][0] = 1.0;
      data[2][1] = 1.0;
      data[2][2] = 1.0;
      for (out_data._4_4_ = 0; out_data._4_4_ < 4; out_data._4_4_ = out_data._4_4_ + 1) {
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,out_data._4_4_,
                   this->m_storage_buffer[out_data._4_4_]);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0xc,&local_98 + (ulong)out_data._4_4_ * 3,0x88e8);
      }
      glu::CallLogWrapper::glBindBufferBase
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,4,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,0x40,(void *)0x0,0x88e4);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      GVar4 = glu::CallLogWrapper::glGetUniformLocation
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,this->m_program,"g_material_id");
      glu::CallLogWrapper::glUniform1i
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,GVar4,1);
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,1,1);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x90d2,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glMemoryBarrier
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x200);
      pvVar5 = glu::CallLogWrapper::glMapBufferRange
                         (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                           super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x40,1);
      if (pvVar5 == (void *)0x0) {
        this_local = (AdvancedIndirectAddressingCase2CS *)&DAT_ffffffffffffffff;
      }
      else {
        for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
          fVar1 = *(float *)((long)pvVar5 + (long)(local_b4 << 2) * 4);
          if ((((fVar1 != data[0][1]) || (NAN(fVar1) || NAN(data[0][1]))) ||
              (fVar1 = *(float *)((long)pvVar5 + (long)(local_b4 * 4 + 1) * 4), fVar1 != data[0][2])
              ) || (((NAN(fVar1) || NAN(data[0][2]) ||
                     (fVar1 = *(float *)((long)pvVar5 + (long)(local_b4 * 4 + 2) * 4),
                     fVar1 != data[1][0])) || (NAN(fVar1) || NAN(data[1][0]))))) {
            anon_unknown_0::Output
                      ("Received: %f, %f, %f, but expected: %f, %f, %f\n",
                       (double)*(float *)((long)pvVar5 + (long)(local_b4 << 2) * 4),
                       (double)*(float *)((long)pvVar5 + (long)(local_b4 * 4 + 1) * 4),
                       (double)*(float *)((long)pvVar5 + (long)(local_b4 * 4 + 2) * 4),
                       (double)data[0][1],(double)data[0][2],(double)data[1][0]);
            glsl_cs._3_1_ = 0;
          }
        }
        glu::CallLogWrapper::glUnmapBuffer
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2);
        GVar4 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                            super_GLWrapper.super_CallLogWrapper,this->m_program,"g_material_id");
        glu::CallLogWrapper::glUniform1i
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar4,3);
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,1,1);
        glu::CallLogWrapper::glMemoryBarrier
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x200);
        pvVar5 = glu::CallLogWrapper::glMapBufferRange
                           (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                             super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x40,1);
        if (pvVar5 == (void *)0x0) {
          this_local = (AdvancedIndirectAddressingCase2CS *)&DAT_ffffffffffffffff;
        }
        else {
          for (local_b8 = 0; local_b8 < 4; local_b8 = local_b8 + 1) {
            fVar1 = *(float *)((long)pvVar5 + (long)(local_b8 << 2) * 4);
            if (((fVar1 != data[2][1]) || (NAN(fVar1) || NAN(data[2][1]))) ||
               ((fVar1 = *(float *)((long)pvVar5 + (long)(local_b8 * 4 + 1) * 4),
                fVar1 != data[2][2] ||
                (((NAN(fVar1) || NAN(data[2][2]) ||
                  (fVar1 = *(float *)((long)pvVar5 + (long)(local_b8 * 4 + 2) * 4),
                  fVar1 != data[3][0])) || (NAN(fVar1) || NAN(data[3][0]))))))) {
              anon_unknown_0::Output
                        ("Received: %f, %f, %f, but expected: %f, %f, %f\n",
                         (double)*(float *)((long)pvVar5 + (long)(local_b8 << 2) * 4),
                         (double)*(float *)((long)pvVar5 + (long)(local_b8 * 4 + 1) * 4),
                         (double)*(float *)((long)pvVar5 + (long)(local_b8 * 4 + 2) * 4),
                         (double)data[2][1],(double)data[2][2],(double)data[3][0]);
              glsl_cs._3_1_ = 0;
            }
          }
          if ((glsl_cs._3_1_ & 1) == 0) {
            this_local = (AdvancedIndirectAddressingCase2CS *)&DAT_ffffffffffffffff;
          }
          else {
            this_local = (AdvancedIndirectAddressingCase2CS *)0x0;
          }
        }
      }
    }
    else {
      this_local = (AdvancedIndirectAddressingCase2CS *)&DAT_ffffffffffffffff;
    }
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		GLint blocksC;
		glGetIntegerv(GL_MAX_COMBINED_SHADER_STORAGE_BLOCKS, &blocksC);
		if (blocksC < 8)
			return NOT_SUPPORTED;
		bool status = true;

		const char* const glsl_cs =
			NL "layout(local_size_x = 4) in;" NL "layout(binding = 0, std430) buffer Material {" NL "  vec3 color;" NL
			   "} g_material[4];" NL "layout(binding = 4, std430) buffer OutputBuffer {" NL "  vec3 color[4];" NL
			   "};" NL "uniform int g_material_id;" NL "void main() {" NL
			   "  color[gl_LocalInvocationIndex] = vec3(g_material[g_material_id].color);" NL "}";

		m_program = CreateProgramCS(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(5, m_storage_buffer);

		/* material buffers */
		const float data[4][3] = {
			{ 1.0f, 0.0f, 0.0f }, { 0.0f, 1.0f, 0.0f }, { 0.0f, 0.0f, 1.0f }, { 1.0f, 1.0f, 0.0f }
		};

		for (GLuint i = 0; i < 4; ++i)
		{
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data[i]), data[i], GL_DYNAMIC_DRAW);
		}

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 4 * 4 * 4, 0, GL_STATIC_DRAW);

		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 1);
		glDispatchCompute(1, 1, 1);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLfloat* out_data = (GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * 4 * 4, GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		const float* expected = &data[1][0];

		for (int i = 0; i < 4; ++i)
		{
			if (out_data[i * 4 + 0] != expected[0] || out_data[i * 4 + 1] != expected[1] ||
				out_data[i * 4 + 2] != expected[2])
			{
				Output("Received: %f, %f, %f, but expected: %f, %f, %f\n", out_data[i * 4 + 0], out_data[i * 4 + 1],
					   out_data[i * 4 + 2], expected[0], expected[1], expected[2]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 3);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		out_data = (GLfloat*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 4 * 4 * 4, GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;
		expected = &data[3][0];

		for (int i = 0; i < 4; ++i)
		{
			if (out_data[i * 4 + 0] != expected[0] || out_data[i * 4 + 1] != expected[1] ||
				out_data[i * 4 + 2] != expected[2])
			{
				Output("Received: %f, %f, %f, but expected: %f, %f, %f\n", out_data[i * 4 + 0], out_data[i * 4 + 1],
					   out_data[i * 4 + 2], expected[0], expected[1], expected[2]);
				status = false;
			}
		}

		if (!status)
		{
			return ERROR;
		}
		return NO_ERROR;
	}